

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_flatten_dot(sexp ctx,sexp ls)

{
  sexp psVar1;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_30;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_30 = (sexp)&DAT_0000023e;
  if (((ulong)ls & 3) == 0) {
    do {
      if (ls->tag != 6) break;
      sexp_push_op(ctx,&local_30,(ls->value).type.name);
      ls = (ls->value).type.cpl;
    } while (((ulong)ls & 3) == 0);
  }
  psVar1 = local_30;
  if (ls != (sexp)&DAT_0000023e) {
    psVar1 = sexp_cons_op(ctx,(sexp)0x0,2,ls,local_30);
  }
  (ctx->value).context.saves = local_28.next;
  psVar1 = sexp_nreverse_op(ctx,(sexp)0x0,1,psVar1);
  return psVar1;
}

Assistant:

static sexp sexp_flatten_dot (sexp ctx, sexp ls) {
  return sexp_nreverse(ctx, sexp_reverse_flatten_dot(ctx, ls));
}